

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void cpptempl::parse_tree(token_vector *tokens,token_vector *tree,TokenType until)

{
  pointer psVar1;
  bool bVar2;
  int iVar3;
  TokenType TVar4;
  token_ptr token;
  token_vector children;
  value_type local_60;
  TokenType local_4c;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  local_48;
  
  local_4c = until;
  do {
    psVar1 = (tokens->
             super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (psVar1 == (tokens->
                  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar1->super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar1->super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    _M_erase(tokens,(tokens->
                    super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    iVar3 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_Token)();
    if (iVar3 == 4) {
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parse_tree(tokens,&local_48,TOKEN_TYPE_ENDFOR);
      (*(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Token[2])(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&local_48);
LAB_00148468:
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      ~vector(&local_48);
LAB_00148470:
      bVar2 = true;
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      push_back(tree,&local_60);
    }
    else {
      iVar3 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (iVar3 == 3) {
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        parse_tree(tokens,&local_48,TOKEN_TYPE_ENDIF);
        (*(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Token[2])(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&local_48);
        goto LAB_00148468;
      }
      TVar4 = (**(local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (TVar4 != local_4c) goto LAB_00148470;
      bVar2 = false;
    }
    if (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

inline void parse_tree(token_vector &tokens, token_vector &tree, TokenType until)
    {
        while(! tokens.empty())
        {
            // 'pops' first item off list
            token_ptr token = tokens[0] ;
            tokens.erase(tokens.begin()) ;

            if (token->gettype() == TOKEN_TYPE_FOR)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDFOR) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == TOKEN_TYPE_IF)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDIF) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == until)
            {
                return ;
            }
            tree.push_back(token) ;
        }
    }